

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_dateTime(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  wchar16 *pwVar6;
  char *pcVar7;
  long lVar8;
  void *pvVar9;
  char *pcVar10;
  bool bVar11;
  Status myStatus;
  Status myStatus_16;
  char iv_1 [20];
  char iv_2 [22];
  char iv_4 [23];
  char iv_3 [23];
  char iv_5 [26];
  char v_3 [26];
  char v_2 [26];
  char v_3_canrep [21];
  char v_2_canrep [21];
  char v_1_canrep [26];
  char v_1 [32];
  StrX local_228;
  char *local_218;
  Status local_20c;
  char local_208 [32];
  char local_1e8 [32];
  char local_1c8 [32];
  char local_1a8 [32];
  char local_188 [32];
  char local_168 [32];
  char local_148 [32];
  char local_128 [32];
  char local_108 [32];
  char local_e8 [32];
  char local_c8 [32];
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  
  builtin_strncpy(local_c8 + 0x10,":59:59.00389  \n",0x10);
  builtin_strncpy(local_c8,"   2000-12-31T23",0x10);
  builtin_strncpy(local_148 + 0x10,":20+13:30",10);
  builtin_strncpy(local_148,"2000-10-01T11:10",0x10);
  builtin_strncpy(local_168 + 0x10,":20-06:00",10);
  builtin_strncpy(local_168,"2000-10-01T11:10",0x10);
  builtin_strncpy(local_208,"0000-12-31T23:59:59",0x14);
  builtin_strncpy(local_1e8 + 0x10,"9:59Z",6);
  builtin_strncpy(local_1e8,"+2000-11-30T23:5",0x10);
  builtin_strncpy(local_1a8,"2000-02-28T23:59.1:59Z",0x17);
  builtin_strncpy(local_1c8,"2000-11-30T01:01:01Z99",0x17);
  builtin_strncpy(local_188 + 0x10,":01Z10:61",10);
  builtin_strncpy(local_188,"2000-02-28T01:01",0x10);
  builtin_strncpy(local_e8 + 0x10,":59.00389",10);
  builtin_strncpy(local_e8,"2000-12-31T23:59",0x10);
  builtin_strncpy(local_108 + 0x10,":20Z",5);
  builtin_strncpy(local_108,"2000-09-30T21:40",0x10);
  builtin_strncpy(local_128 + 0x10,":20Z",5);
  builtin_strncpy(local_128,"2000-10-01T17:10",0x10);
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1226,local_c8,local_228.fLocalForm,1);
    StrX::~StrX(&local_228);
    errSeen = 1;
  }
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1227,local_148,local_228.fLocalForm,1);
    StrX::~StrX(&local_228);
    errSeen = 1;
  }
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1228,local_168,local_228.fLocalForm,1);
    StrX::~StrX(&local_228);
    errSeen = 1;
  }
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    if ((int)local_218 != 6) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_218 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122b,local_208,local_228.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_00129c6e;
    }
  }
  else {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122b,local_208,local_228.fLocalForm,0);
LAB_00129c6e:
    StrX::~StrX(&local_228);
    errSeen = 1;
  }
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    if ((int)local_218 != 6) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_218 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122c,local_1e8,local_228.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_00129d74;
    }
  }
  else {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122c,local_1e8,local_228.fLocalForm,0);
LAB_00129d74:
    StrX::~StrX(&local_228);
    errSeen = 1;
  }
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    if ((int)local_218 != 6) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_218 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122d,local_1a8,local_228.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_00129e7a;
    }
  }
  else {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122d,local_1a8,local_228.fLocalForm,0);
LAB_00129e7a:
    StrX::~StrX(&local_228);
    errSeen = 1;
  }
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    if ((int)local_218 != 9) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_218 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122e,local_1c8,local_228.fLocalForm,"st_FODT0003",pcVar10);
      goto LAB_00129f80;
    }
  }
  else {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122e,local_1c8,local_228.fLocalForm,0);
LAB_00129f80:
    StrX::~StrX(&local_228);
    errSeen = 1;
  }
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  local_228.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_228.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_228);
  if (cVar2 == '\0') {
    if ((int)local_218 == 9) goto LAB_0012a092;
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    if (((ulong)local_218 & 0xffffffff) < 0xb) {
      pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
    }
    else {
      pcVar10 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x122f,local_188,local_228.fLocalForm,"st_FODT0003",pcVar10);
  }
  else {
    StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122f,local_188,local_228.fLocalForm,0);
  }
  StrX::~StrX(&local_228);
  errSeen = 1;
LAB_0012a092:
  bVar11 = true;
  do {
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0x6;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1249,local_c8);
      StrX::~StrX(&local_228);
      errSeen = 1;
    }
    else {
      local_50 = 0xc000007d0;
      uStack_48 = 0x170000001f;
      local_40 = 0x3b0000003b;
      local_38 = 0x3f6fddebd9018e75;
      expValue.fValue.f_double = 2.54639504797146e-313;
      expValue._0_8_ = uStack_58;
      expValue.fValue._8_8_ = 0x170000001f;
      expValue.fValue._16_8_ = 0x3b0000003b;
      expValue.fValue.f_datetime.f_milisec = 0.00389;
      bVar3 = compareActualValue(dt_dateTime,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0x6;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124a,local_148);
      StrX::~StrX(&local_228);
      errSeen = 1;
    }
    else {
      local_78 = 0x9000007d0;
      uStack_70 = 0x150000001e;
      local_68 = 0x1400000028;
      local_60 = 0;
      expValue_00.fValue.f_double = 1.90979631068187e-313;
      expValue_00._0_8_ = uStack_80;
      expValue_00.fValue._8_8_ = 0x150000001e;
      expValue_00.fValue._16_8_ = 0x1400000028;
      expValue_00.fValue.f_datetime.f_milisec = 0.0;
      bVar3 = compareActualValue(dt_dateTime,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0x6;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124b,local_168);
      StrX::~StrX(&local_228);
      errSeen = 1;
    }
    else {
      local_a0 = 0xa000007d0;
      uStack_98 = 0x1100000001;
      local_90 = 0x140000000a;
      local_88 = 0;
      expValue_01.fValue.f_double = 2.1219958897784e-313;
      expValue_01._0_8_ = uStack_a8;
      expValue_01.fValue._8_8_ = 0x1100000001;
      expValue_01.fValue._16_8_ = 0x140000000a;
      expValue_01.fValue.f_datetime.f_milisec = 0.0;
      bVar3 = compareActualValue(dt_dateTime,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_218 != 6) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124e,local_208,local_228.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x124e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124e,local_208);
      StrX::~StrX(&local_228);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_218 != 6) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124f,local_1e8,local_228.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x124f;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124f,local_1e8);
      StrX::~StrX(&local_228);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_218 != 6) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1250,local_1a8,local_228.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x1250;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1250,local_1a8);
      StrX::~StrX(&local_228);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_218 != 9) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1251,local_1c8,local_228.fLocalForm,"st_FODT0003",pcVar10);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x1251;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1251,local_1c8);
      StrX::~StrX(&local_228);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_218 != 9) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1252,local_188,local_228.fLocalForm,"st_FODT0003",pcVar10);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar9 = (void *)0x1252;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1252,local_188);
      StrX::~StrX(&local_228);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    bVar3 = bVar11 != false;
    bVar11 = false;
  } while (bVar3);
  bVar11 = true;
  do {
    local_20c = st_Init;
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_228.fUnicodeForm,dt_dateTime,&local_20c,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x126e,local_c8);
      StrX::~StrX(&local_228);
      errSeen = 1;
    }
    else {
      local_218 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_e8;
      if (local_218 != pcVar10) {
        pcVar7 = local_218;
        if (local_218 == (char *)0x0) {
LAB_0012aa96:
          if (*pcVar10 == '\0') goto LAB_0012aae6;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0012aa96;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x126e,local_c8,local_228.fLocalForm,local_218,local_e8);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
LAB_0012aae6:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_218,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_20c = st_Init;
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_228.fUnicodeForm,dt_dateTime,&local_20c,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x126f,local_148);
      StrX::~StrX(&local_228);
      errSeen = 1;
    }
    else {
      local_218 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_108;
      if (local_218 != pcVar10) {
        pcVar7 = local_218;
        if (local_218 == (char *)0x0) {
LAB_0012abd9:
          if (*pcVar10 == '\0') goto LAB_0012ac29;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0012abd9;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x126f,local_148,local_228.fLocalForm,local_218,local_108);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
LAB_0012ac29:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_218,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_20c = st_Init;
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_228.fUnicodeForm,dt_dateTime,&local_20c,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1270,local_168);
      StrX::~StrX(&local_228);
      errSeen = 1;
    }
    else {
      local_218 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_128;
      if (local_218 != pcVar10) {
        pcVar7 = local_218;
        if (local_218 == (char *)0x0) {
LAB_0012ad1c:
          if (*pcVar10 == '\0') goto LAB_0012ad6c;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0012ad1c;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x1270,local_168,local_228.fLocalForm,local_218,local_128);
        StrX::~StrX(&local_228);
        errSeen = 1;
      }
LAB_0012ad6c:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_218,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (lVar8 == 0) {
      if ((int)local_218 != 6) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1273,local_208,local_228.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_228);
        goto LAB_0012ae7e;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1273,local_208);
      StrX::~StrX(&local_228);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0012ae7e:
      errSeen = 1;
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (lVar8 == 0) {
      if ((int)local_218 != 6) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1274,local_1e8,local_228.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_228);
        goto LAB_0012af87;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1274,local_1e8);
      StrX::~StrX(&local_228);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0012af87:
      errSeen = 1;
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (lVar8 == 0) {
      if ((int)local_218 != 6) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1275,local_1a8,local_228.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_228);
        goto LAB_0012b090;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1275,local_1a8);
      StrX::~StrX(&local_228);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0012b090:
      errSeen = 1;
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (lVar8 == 0) {
      if ((int)local_218 != 9) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1276,local_1c8,local_228.fLocalForm,"st_FODT0003",pcVar10);
        StrX::~StrX(&local_228);
        goto LAB_0012b199;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1276,local_1c8);
      StrX::~StrX(&local_228);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0012b199:
      errSeen = 1;
    }
    local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
    local_228.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_228.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_228.fUnicodeForm,dt_dateTime,(Status *)&local_218,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_228);
    if (lVar8 == 0) {
      if ((int)local_218 != 9) {
        StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_218 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_218 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1277,local_188,local_228.fLocalForm,"st_FODT0003",pcVar10);
        StrX::~StrX(&local_228);
        goto LAB_0012b2a2;
      }
    }
    else {
      StrX::StrX(&local_228,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1277,local_188);
      StrX::~StrX(&local_228);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0012b2a2:
      errSeen = 1;
    }
    bVar3 = bVar11 == false;
    bVar11 = false;
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_dateTime()
{
    const XSValue::DataType dt = XSValue::dt_dateTime;
    bool  toValidate = true;

    const char v_1[]="   2000-12-31T23:59:59.00389  \n";
    const char v_2[]="2000-10-01T11:10:20+13:30";
    const char v_3[]="2000-10-01T11:10:20-06:00";

    const char iv_1[]="0000-12-31T23:59:59";
    const char iv_2[]="+2000-11-30T23:59:59Z";
    const char iv_3[]="2000-02-28T23:59.1:59Z";
    const char iv_4[]="2000-11-30T01:01:01Z99";
    const char iv_5[]="2000-02-28T01:01:01Z10:61";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="2000-12-31T23:59:59.00389";
    const char v_2_canrep[]="2000-09-30T21:40:20Z";
    const char v_3_canrep[]="2000-10-01T17:10:20Z";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 12;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 23;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 59;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 59;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0.00389;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 9;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 21;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 40;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 10;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 17;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 10;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

 /***
 * E2-41
 *
 *  3.2.7.2 Canonical representation
 *
 *  Except for trailing fractional zero digits in the seconds representation,
 *  '24:00:00' time representations, and timezone (for timezoned values),
 *  the mapping from literals to values is one-to-one. Where there is more
 *  than one possible representation, the canonical representation is as follows:
 *  redundant trailing zero digits in fractional-second literals are prohibited.
 *  An hour representation of '24' is prohibited. Timezoned values are canonically
 *  represented by appending 'Z' to the nontimezoned representation. (All
 *  timezoned dateTime values are UTC.)
 *
 *  .'24:00:00' -> '00:00:00'
 *  .milisecond: trailing zeros removed
 *  .'Z'
 *
 ***/

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_4, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);
    VALIDATE_TEST(iv_5, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_4, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
        ACTVALUE_TEST(iv_5, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_4, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);
        CANREP_TEST(iv_5, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);

    }

}